

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O1

BigInteger * __thiscall
Algorithms::discreteLog
          (BigInteger *__return_storage_ptr__,Algorithms *this,BigInteger *a,BigInteger *b,
          BigInteger *m)

{
  pointer piVar1;
  bool bVar2;
  longlong lVar3;
  mapped_type *pmVar4;
  const_iterator cVar5;
  ostream *poVar6;
  int i;
  long lVar7;
  double in_XMM0_Qa;
  BigInteger A;
  BigInteger n;
  map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
  mp;
  BigInteger cur_a;
  BigInteger local_110;
  BigInteger *local_f0;
  BigInteger local_e8;
  BigInteger local_c8;
  BigInteger local_a8;
  _Rb_tree<BigIntegerLibrary::BigInteger,_std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>,_std::_Select1st<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
  local_88;
  BigInteger *local_58;
  BigInteger local_50;
  
  local_f0 = a;
  local_58 = b;
  BigIntegerLibrary::sqrt((BigIntegerLibrary *)&local_e8,in_XMM0_Qa);
  BigIntegerLibrary::BigInteger::operator+((BigInteger *)&local_88,&local_e8,1);
  BigIntegerLibrary::BigInteger::operator/(&local_a8,(BigInteger *)&local_88,100);
  if ((pointer)local_88._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._M_impl._0_8_,
                    (long)local_88._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_88._M_impl._0_8_);
  }
  if (local_e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  BigIntegerLibrary::powm(&local_e8,local_f0,&local_a8,m);
  BigIntegerLibrary::BigInteger::BigInteger(&local_50,&local_e8);
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar7 = 1;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    lVar3 = BigIntegerLibrary::BigInteger::to_int(&local_a8);
    if (lVar3 < lVar7) break;
    BigIntegerLibrary::BigInteger::BigInteger(&local_110,lVar7);
    pmVar4 = std::
             map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
             ::operator[]((map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
                           *)&local_88,&local_50);
    BigIntegerLibrary::BigInteger::operator=(pmVar4,&local_110);
    if (local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    BigIntegerLibrary::BigInteger::operator*(&local_c8,&local_50,&local_e8);
    BigIntegerLibrary::BigInteger::operator%(&local_110,&local_c8,m);
    BigIntegerLibrary::BigInteger::operator=(&local_50,&local_110);
    if (local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_c8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_c8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    lVar7 = lVar7 + 1;
  }
  BigIntegerLibrary::BigInteger::operator=(&local_50,local_58);
  lVar7 = 0;
  while( true ) {
    lVar3 = BigIntegerLibrary::BigInteger::to_int(&local_a8);
    if (lVar3 <= lVar7) break;
    cVar5 = std::
            _Rb_tree<BigIntegerLibrary::BigInteger,_std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>,_std::_Select1st<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
            ::find(&local_88,&local_50);
    if ((_Rb_tree_header *)cVar5._M_node != &local_88._M_impl.super__Rb_tree_header) {
      pmVar4 = std::
               map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
               ::operator[]((map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
                             *)&local_88,&local_50);
      BigIntegerLibrary::BigInteger::operator*(&local_110,pmVar4,&local_a8);
      BigIntegerLibrary::BigInteger::operator-(__return_storage_ptr__,&local_110,lVar7);
      if (local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      bVar2 = BigIntegerLibrary::BigInteger::operator<(__return_storage_ptr__,m);
      if (bVar2) goto LAB_00109998;
      piVar1 = (__return_storage_ptr__->num).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar1 != (pointer)0x0) {
        operator_delete(piVar1,(long)(__return_storage_ptr__->num).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage - (long)piVar1);
      }
    }
    BigIntegerLibrary::BigInteger::operator*(&local_c8,&local_50,local_f0);
    BigIntegerLibrary::BigInteger::operator%(&local_110,&local_c8,m);
    BigIntegerLibrary::BigInteger::operator=(&local_50,&local_110);
    if (local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_c8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_c8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    lVar7 = lVar7 + 1;
  }
  poVar6 = BigIntegerLibrary::operator<<((ostream *)&std::cout,&local_a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  BigIntegerLibrary::BigInteger::BigInteger(__return_storage_ptr__,-1);
LAB_00109998:
  std::
  _Rb_tree<BigIntegerLibrary::BigInteger,_std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>,_std::_Select1st<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
  ::~_Rb_tree(&local_88);
  if (local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInteger Algorithms::discreteLog(BigInteger a, BigInteger b, BigInteger m) {
    BigInteger n = (sqrt(m) + 1) / 100;
    BigInteger A = powm(a, n, m);
    BigInteger cur_a = A;
    map<BigInteger, BigInteger> mp;
    for (int i = 1; i <= n.to_int(); ++i) {
        mp[cur_a] = i;
        cur_a = (cur_a * A) % m;
    }
    cur_a = b;
    for (int i = 0; i < n.to_int(); ++i) {
        if (mp.count(cur_a)) {
            BigInteger ans = mp[cur_a] * n - i;
            if (ans < m) {
                return ans;
            }
        }
        cur_a = (cur_a * a) % m;
    }
    cout << n << endl;
    return -1;
}